

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O2

void cJSON_AddItemReferenceToObject(cJSON *object,char *string,cJSON *item)

{
  cJSON *item_00;
  
  item_00 = create_reference(item,(internal_hooks *)string);
  cJSON_AddItemToObject(object,string,item_00);
  return;
}

Assistant:

CJSON_PUBLIC(void) cJSON_AddItemReferenceToObject(cJSON *object, const char *string, cJSON *item)
{
    cJSON_AddItemToObject(object, string, create_reference(item, &global_hooks));
}